

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O2

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHashAndCountVariables
          (HashingClauseVariantIndex *this,Literal *l,VarCounts *varCnts,uint hash_begin)

{
  anon_union_8_2_f154dc0f_for_Term_10 *tl2;
  bool bVar1;
  type tVar2;
  Comparison CVar3;
  uint uVar4;
  anon_union_8_2_f154dc0f_for_Term_10 *ptl;
  TermList *arg;
  anon_union_8_2_f154dc0f_for_Term_10 *tl1;
  
  bVar1 = Kernel::Term::ground(&l->super_Term);
  if (bVar1) {
    tVar2 = Lib::DefaultHash::hash<Kernel::Literal>(l,hash_begin);
    return tVar2;
  }
  tVar2 = Lib::DefaultHash::hash<unsigned_int>
                    (((uint)(l->super_Term)._args[0]._content >> 2 & 1) +
                     (l->super_Term)._functor * 2,hash_begin);
  tl1 = (anon_union_8_2_f154dc0f_for_Term_10 *)
        ((l->super_Term)._args + (*(uint *)&(l->super_Term).field_0xc & 0xfffffff));
  if ((l->super_Term)._functor == 0) {
    tl2 = tl1 + -1;
    CVar3 = VariableIgnoringComparator::compare(&tl1->_sort,&tl2->_sort);
    ptl = tl2;
    if (CVar3 == LESS) {
      ptl = tl1;
      tl1 = tl2;
    }
    uVar4 = computeHashAndCountVariables(this,&tl1->_sort,varCnts,tVar2);
    uVar4 = computeHashAndCountVariables(this,&ptl->_sort,varCnts,uVar4);
    return uVar4;
  }
  for (; (tl1->_vars & 3) != 2; tl1 = tl1 + -1) {
    tVar2 = computeHashAndCountVariables(this,&tl1->_sort,varCnts,tVar2);
  }
  return tVar2;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHashAndCountVariables(Literal* l, VarCounts& varCnts, unsigned hash_begin) {
  //cout << "Literal " << l->toString() << endl;

  if (l->ground()) {
    // no variables to count
    // just hash the pointer
    return DefaultHash::hash(l, hash_begin);
  }

  //cout << "will hash header " << header << endl;

  unsigned header = l->header();

  // hashes the predicate symbol and the polarity
  unsigned hash = DefaultHash::hash(header, hash_begin);

  if(l->isEquality()) {
    TermList* ll = l->nthArgument(0);
    TermList* lr = l->nthArgument(1);
    if (VariableIgnoringComparator::compare(ll,lr) == LESS) {
      swap(ll,lr);
    }

    hash = computeHashAndCountVariables(ll,varCnts,hash);
    hash = computeHashAndCountVariables(lr,varCnts,hash);
  } else {
    for(TermList* arg=l->args(); arg->isNonEmpty(); arg=arg->next()) {
      hash = computeHashAndCountVariables(arg,varCnts,hash);
    }
  }

  return hash;
}